

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O0

Expected<llvm::DWARFDebugLoc::LocationList> * __thiscall
llvm::DWARFDebugLoc::parseOneLocationList
          (Expected<llvm::DWARFDebugLoc::LocationList> *__return_storage_ptr__,DWARFDebugLoc *this,
          DWARFDataExtractor *Data,uint64_t *Offset)

{
  byte bVar1;
  bool bVar2;
  uint16_t uVar3;
  uint64_t uVar4;
  ErrorInfoBase *pEVar5;
  uint Bytes;
  undefined1 local_e0 [8];
  Error Err;
  Entry E;
  Cursor C;
  undefined1 local_90 [8];
  LocationList LL;
  uint64_t *Offset_local;
  DWARFDataExtractor *Data_local;
  DWARFDebugLoc *this_local;
  
  LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer._32_8_ =
       Offset;
  LocationList::LocationList((LocationList *)local_90);
  local_90 = *(undefined1 (*) [8])
              LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].
              buffer._32_8_;
  bVar1 = DataExtractor::getAddressSize(&Data->super_DataExtractor);
  this->AddressSize = (uint)bVar1;
  DataExtractor::Cursor::Cursor
            ((Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>,
             *(uint64_t *)
              LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].
              buffer._32_8_);
  do {
    Entry::Entry((Entry *)&Err);
    Err.Payload = (ErrorInfoBase *)
                  DWARFDataExtractor::getRelocatedAddress
                            (Data,(Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>,
                             (uint64_t *)0x0);
    E.Begin = DWARFDataExtractor::getRelocatedAddress
                        (Data,(Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>,
                         (uint64_t *)0x0);
    DataExtractor::Cursor::takeError((Cursor *)local_e0);
    bVar2 = Error::operator_cast_to_bool((Error *)local_e0);
    if (bVar2) {
      Error::Error((Error *)&Bytes,(Error *)local_e0);
      Expected<llvm::DWARFDebugLoc::LocationList>::Expected(__return_storage_ptr__,(Error *)&Bytes);
      Error::~Error((Error *)&Bytes);
    }
    Error::~Error((Error *)local_e0);
    if (!bVar2) {
      if ((Err.Payload == (ErrorInfoBase *)0x0) && (E.Begin == 0)) {
        uVar4 = DataExtractor::Cursor::tell
                          ((Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>);
        *(uint64_t *)
         LL.Entries.super_SmallVectorStorage<llvm::DWARFDebugLoc::Entry,_2U>.InlineElts[1].buffer.
         _32_8_ = uVar4;
        Expected<llvm::DWARFDebugLoc::LocationList>::Expected<llvm::DWARFDebugLoc::LocationList>
                  (__return_storage_ptr__,(LocationList *)local_90,(type *)0x0);
        bVar2 = true;
      }
      else {
        pEVar5 = (ErrorInfoBase *)0xffffffffffffffff;
        if (this->AddressSize == 4) {
          pEVar5 = (ErrorInfoBase *)0xffffffff;
        }
        if (Err.Payload != pEVar5) {
          uVar3 = DataExtractor::getU16
                            (&Data->super_DataExtractor,
                             (Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>);
          DataExtractor::getU8
                    (&Data->super_DataExtractor,
                     (Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>,
                     (SmallVectorImpl<unsigned_char> *)&E.End,(uint)uVar3);
        }
        SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false> *)&LL,(Entry *)&Err);
        bVar2 = false;
      }
    }
    Entry::~Entry((Entry *)&Err);
  } while (bVar2 == false);
  DataExtractor::Cursor::~Cursor((Cursor *)&E.Loc.super_SmallVectorStorage<unsigned_char,_4U>);
  LocationList::~LocationList((LocationList *)local_90);
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFDebugLoc::LocationList>
DWARFDebugLoc::parseOneLocationList(const DWARFDataExtractor &Data,
                                    uint64_t *Offset) {
  LocationList LL;
  LL.Offset = *Offset;
  AddressSize = Data.getAddressSize();
  DataExtractor::Cursor C(*Offset);

  // 2.6.2 Location Lists
  // A location list entry consists of:
  while (true) {
    Entry E;

    // 1. A beginning address offset. ...
    E.Begin = Data.getRelocatedAddress(C);

    // 2. An ending address offset. ...
    E.End = Data.getRelocatedAddress(C);

    if (Error Err = C.takeError())
      return std::move(Err);

    // The end of any given location list is marked by an end of list entry,
    // which consists of a 0 for the beginning address offset and a 0 for the
    // ending address offset.
    if (E.Begin == 0 && E.End == 0) {
      *Offset = C.tell();
      return LL;
    }

    if (E.Begin != (AddressSize == 4 ? -1U : -1ULL)) {
      unsigned Bytes = Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    LL.Entries.push_back(std::move(E));
  }
}